

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

DefinitionLookupResult * __thiscall
slang::ast::Compilation::tryGetDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view lookupName,
          Scope *scope)

{
  group_type_pointer pgVar1;
  RootSymbol *pRVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  pointer ppSVar5;
  SourceLibrary *pSVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *ptVar12;
  bool bVar13;
  InstanceBodySymbol *pIVar14;
  SourceLibrary *pSVar15;
  uint uVar16;
  Symbol *pSVar17;
  ulong uVar18;
  Symbol *pSVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  value_type_pointer in_R10;
  value_type_pointer ppVar23;
  value_type_pointer ppVar24;
  value_type_pointer __u;
  pointer ppSVar25;
  pointer ppSVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  ResolvedConfig *local_c0;
  size_t seed;
  pointer ppSStack_90;
  pointer local_88;
  undefined8 local_78;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> local_60;
  ulong local_40;
  ulong local_38;
  
  ppSStack_90 = (pointer)seed;
  pIVar14 = Scope::getContainingInstance(scope);
  if ((pIVar14 == (InstanceBodySymbol *)0x0) || (pIVar14->parentInstance == (InstanceSymbol *)0x0))
  {
    local_c0 = (ResolvedConfig *)0x0;
  }
  else {
    local_c0 = pIVar14->parentInstance->resolvedConfig;
  }
  pRVar2 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_60.first.definition = (Symbol *)&pRVar2->super_Scope;
  if (pRVar2 == (RootSymbol *)0x0) {
    local_60.first.definition = (Symbol *)0x0;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = ppSStack_90;
  _seed = auVar11 << 0x40;
  local_60.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
  local_60.first.configRule = (ConfigRule *)lookupName._M_str;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)&local_60);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = seed;
  uVar20 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
  uVar18 = uVar20 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar22 = (uVar20 & 0xff) * 4;
  uVar29 = (&UNK_0049b57c)[lVar22];
  uVar30 = (&UNK_0049b57d)[lVar22];
  uVar31 = (&UNK_0049b57e)[lVar22];
  uVar32 = (&UNK_0049b57f)[lVar22];
  __u = (value_type_pointer)0x0;
  uVar33 = uVar29;
  uVar34 = uVar30;
  uVar35 = uVar31;
  uVar36 = uVar32;
  uVar37 = uVar29;
  uVar38 = uVar30;
  uVar39 = uVar31;
  uVar40 = uVar32;
  uVar41 = uVar29;
  uVar42 = uVar30;
  uVar43 = uVar31;
  uVar44 = uVar32;
  do {
    pgVar3 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar18;
    auVar27[0] = -(pgVar1->m[0].n == uVar29);
    auVar27[1] = -(pgVar1->m[1].n == uVar30);
    auVar27[2] = -(pgVar1->m[2].n == uVar31);
    auVar27[3] = -(pgVar1->m[3].n == uVar32);
    auVar27[4] = -(pgVar1->m[4].n == uVar33);
    auVar27[5] = -(pgVar1->m[5].n == uVar34);
    auVar27[6] = -(pgVar1->m[6].n == uVar35);
    auVar27[7] = -(pgVar1->m[7].n == uVar36);
    auVar27[8] = -(pgVar1->m[8].n == uVar37);
    auVar27[9] = -(pgVar1->m[9].n == uVar38);
    auVar27[10] = -(pgVar1->m[10].n == uVar39);
    auVar27[0xb] = -(pgVar1->m[0xb].n == uVar40);
    auVar27[0xc] = -(pgVar1->m[0xc].n == uVar41);
    auVar27[0xd] = -(pgVar1->m[0xd].n == uVar42);
    auVar27[0xe] = -(pgVar1->m[0xe].n == uVar43);
    auVar27[0xf] = -(pgVar1->m[0xf].n == uVar44);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
    if (uVar16 != 0) {
      ppVar24 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.elements_;
      local_78._0_2_ = CONCAT11(uVar30,uVar29);
      local_78._0_3_ = CONCAT12(uVar31,(undefined2)local_78);
      local_78._0_4_ = CONCAT13(uVar32,(undefined3)local_78);
      local_78._0_5_ = CONCAT14(uVar33,(undefined4)local_78);
      local_78._0_6_ = CONCAT15(uVar34,(undefined5)local_78);
      local_78._0_7_ = CONCAT16(uVar35,(undefined6)local_78);
      local_78 = (pointer)CONCAT17(uVar36,(undefined7)local_78);
      ppVar23 = in_R10;
      uStack_70 = uVar37;
      uStack_6f = uVar38;
      uStack_6e = uVar39;
      uStack_6d = uVar40;
      uStack_6c = uVar41;
      uStack_6b = uVar42;
      uStack_6a = uVar43;
      uStack_69 = uVar44;
      do {
        uVar7 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        in_R10 = ppVar24 + uVar18 * 0xf + (ulong)uVar7;
        bVar13 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_60,&in_R10->first);
        if (!bVar13) {
          uVar16 = uVar16 - 1 & uVar16;
          in_R10 = ppVar23;
        }
        if (bVar13) goto LAB_0013fb89;
        ppVar23 = in_R10;
      } while (uVar16 != 0);
      uVar29 = (uchar)local_78;
      uVar30 = local_78._1_1_;
      uVar31 = local_78._2_1_;
      uVar32 = local_78._3_1_;
      uVar33 = local_78._4_1_;
      uVar34 = local_78._5_1_;
      uVar35 = local_78._6_1_;
      uVar36 = local_78._7_1_;
      uVar37 = uStack_70;
      uVar38 = uStack_6f;
      uVar39 = uStack_6e;
      uVar40 = uStack_6d;
      uVar41 = uStack_6c;
      uVar42 = uStack_6b;
      uVar43 = uStack_6a;
      uVar44 = uStack_69;
      if (bVar13) goto LAB_0013fb89;
    }
    if ((pgVar3[uVar18].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) break;
    ppVar24 = (value_type_pointer)
              (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
    ptVar12 = &__u->first;
    __u = (value_type_pointer)
          ((long)&(__u->first).
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl + 1);
    uVar18 = (long)&(ptVar12->
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    ).super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
             uVar18 + 1 & (ulong)ppVar24;
  } while (__u <= ppVar24);
  in_R10 = (value_type_pointer)0x0;
LAB_0013fb89:
  if (in_R10 == (value_type_pointer)0x0) {
    if (local_c0 != (ResolvedConfig *)0x0) {
      _seed = (undefined1  [16])0x0;
      local_88 = (pointer)0x0;
      resolveConfigRules(&local_60,this,lookupName,scope,local_c0,(ConfigRule *)0x0,
                         (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                         &seed);
      __return_storage_ptr__->configRule = local_60.first.configRule;
      __return_storage_ptr__->definition = local_60.first.definition;
      __return_storage_ptr__->configRoot = local_60.first.configRoot;
      if (seed == 0) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)seed,(long)local_88 - seed);
      return __return_storage_ptr__;
    }
  }
  else {
    pSVar19 = (Symbol *)scope;
    ppVar24 = in_R10;
    if ((in_R10->second).second == true) {
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = ppSStack_90;
        _seed = auVar10 << 0x40;
        local_60.first.definition = pSVar19;
        local_60.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
        local_60.first.configRule = (ConfigRule *)lookupName._M_str;
        slang::detail::hashing::
        HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
        ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       *)&local_60);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = seed;
        uVar20 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,0);
        uVar21 = uVar20 >> ((byte)(this->definitionMap).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar22 = (uVar20 & 0xff) * 4;
        uVar29 = (&UNK_0049b57c)[lVar22];
        uVar30 = (&UNK_0049b57d)[lVar22];
        uVar31 = (&UNK_0049b57e)[lVar22];
        uVar32 = (&UNK_0049b57f)[lVar22];
        uVar18 = 0;
        uVar33 = uVar29;
        uVar34 = uVar30;
        uVar35 = uVar31;
        uVar36 = uVar32;
        uVar37 = uVar29;
        uVar38 = uVar30;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar29;
        uVar42 = uVar30;
        uVar43 = uVar31;
        uVar44 = uVar32;
        do {
          pgVar3 = (this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.groups_;
          pgVar1 = pgVar3 + uVar21;
          auVar28[0] = -(pgVar1->m[0].n == uVar29);
          auVar28[1] = -(pgVar1->m[1].n == uVar30);
          auVar28[2] = -(pgVar1->m[2].n == uVar31);
          auVar28[3] = -(pgVar1->m[3].n == uVar32);
          auVar28[4] = -(pgVar1->m[4].n == uVar33);
          auVar28[5] = -(pgVar1->m[5].n == uVar34);
          auVar28[6] = -(pgVar1->m[6].n == uVar35);
          auVar28[7] = -(pgVar1->m[7].n == uVar36);
          auVar28[8] = -(pgVar1->m[8].n == uVar37);
          auVar28[9] = -(pgVar1->m[9].n == uVar38);
          auVar28[10] = -(pgVar1->m[10].n == uVar39);
          auVar28[0xb] = -(pgVar1->m[0xb].n == uVar40);
          auVar28[0xc] = -(pgVar1->m[0xc].n == uVar41);
          auVar28[0xd] = -(pgVar1->m[0xd].n == uVar42);
          auVar28[0xe] = -(pgVar1->m[0xe].n == uVar43);
          auVar28[0xf] = -(pgVar1->m[0xf].n == uVar44);
          uVar16 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
          local_38 = uVar21;
          if (uVar16 != 0) {
            ppVar24 = (this->definitionMap).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                      .arrays.elements_;
            local_78._0_2_ = CONCAT11(uVar30,uVar29);
            local_78._0_3_ = CONCAT12(uVar31,(undefined2)local_78);
            local_78._0_4_ = CONCAT13(uVar32,(undefined3)local_78);
            local_78._0_5_ = CONCAT14(uVar33,(undefined4)local_78);
            local_78._0_6_ = CONCAT15(uVar34,(undefined5)local_78);
            local_78._0_7_ = CONCAT16(uVar35,(undefined6)local_78);
            local_78 = (pointer)CONCAT17(uVar36,(undefined7)local_78);
            ppVar23 = __u;
            uStack_70 = uVar37;
            uStack_6f = uVar38;
            uStack_6e = uVar39;
            uStack_6d = uVar40;
            uStack_6c = uVar41;
            uStack_6b = uVar42;
            uStack_6a = uVar43;
            uStack_69 = uVar44;
            local_40 = uVar18;
            do {
              uVar7 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              __u = ppVar24 + uVar21 * 0xf + (ulong)uVar7;
              bVar13 = std::
                       __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                       ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               *)&local_60,&__u->first);
              if (!bVar13) {
                uVar16 = uVar16 - 1 & uVar16;
                __u = ppVar23;
              }
              if (bVar13) goto LAB_0013fd2d;
              ppVar23 = __u;
            } while (uVar16 != 0);
            uVar18 = local_40;
            uVar29 = (uchar)local_78;
            uVar30 = local_78._1_1_;
            uVar31 = local_78._2_1_;
            uVar32 = local_78._3_1_;
            uVar33 = local_78._4_1_;
            uVar34 = local_78._5_1_;
            uVar35 = local_78._6_1_;
            uVar36 = local_78._7_1_;
            uVar37 = uStack_70;
            uVar38 = uStack_6f;
            uVar39 = uStack_6e;
            uVar40 = uStack_6d;
            uVar41 = uStack_6c;
            uVar42 = uStack_6b;
            uVar43 = uStack_6a;
            uVar44 = uStack_69;
            if (bVar13) goto LAB_0013fd2d;
          }
          if ((pgVar3[uVar21].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7]) == 0) {
            __u = (value_type_pointer)0x0;
            goto LAB_0013fd2d;
          }
          uVar4 = (this->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .arrays.groups_size_mask;
          lVar22 = local_38 + uVar18;
          uVar18 = uVar18 + 1;
          uVar21 = lVar22 + 1U & uVar4;
        } while (uVar18 <= uVar4);
        __u = (value_type_pointer)0x0;
LAB_0013fd2d:
        ppVar24 = __u;
        if ((__u != (value_type_pointer)0x0) ||
           (pSVar19 = (Symbol *)((Symbol *)(pSVar19->name)._M_len)->parentScope, ppVar24 = in_R10,
           pSVar19 == (Symbol *)0x0)) break;
        pRVar2 = (this->root)._M_t.
                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar17 = (Symbol *)&pRVar2->super_Scope;
        if (pRVar2 == (RootSymbol *)0x0) {
          pSVar17 = (Symbol *)0x0;
        }
      } while (pSVar19 != pSVar17);
    }
    if (local_c0 != (ResolvedConfig *)0x0) {
      resolveConfigRules(&local_60,this,lookupName,scope,local_c0,(ConfigRule *)0x0,
                         &(ppVar24->second).first);
      __return_storage_ptr__->configRule = local_60.first.configRule;
      __return_storage_ptr__->definition = local_60.first.definition;
      __return_storage_ptr__->configRoot = local_60.first.configRoot;
      return __return_storage_ptr__;
    }
    ppSVar26 = (this->defaultLiblist).
               super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_78 = (this->defaultLiblist).
               super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar26 != local_78) {
      do {
        ppSVar25 = (ppVar24->second).first.
                   super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppSVar5 = (ppVar24->second).first.
                  super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppSVar25 != ppSVar5) {
          pSVar6 = *ppSVar26;
          do {
            pSVar19 = *ppSVar25;
            pSVar15 = Symbol::getSourceLibrary(pSVar19);
            if (pSVar15 == pSVar6) {
              __return_storage_ptr__->definition = pSVar19;
              goto LAB_0013fed6;
            }
            ppSVar25 = ppSVar25 + 1;
          } while (ppSVar25 != ppSVar5);
        }
        ppSVar26 = ppSVar26 + 1;
      } while (ppSVar26 != local_78);
    }
    ppSVar25 = (ppVar24->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar25 !=
        (ppVar24->second).first.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __return_storage_ptr__->definition = *ppSVar25;
LAB_0013fed6:
      __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
      __return_storage_ptr__->configRule = (ConfigRule *)0x0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->definition = (Symbol *)0x0;
  __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
  __return_storage_ptr__->configRule = (ConfigRule *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::tryGetDefinition(std::string_view lookupName,
                                                                  const Scope& scope) const {
    // Try to find a config block for this scope to help choose the right definition.
    const ResolvedConfig* resolvedConfig = nullptr;
    if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
        resolvedConfig = inst->parentInstance->resolvedConfig;

    // Always search in the root scope to start. Most definitions are global.
    auto it = definitionMap.find({lookupName, root.get()});
    if (it == definitionMap.end()) {
        // If there's a config it might be able to provide an
        // override for this cell name.
        if (resolvedConfig)
            return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, {}).first;
        return {};
    }

    // If the second flag is set it means there are nested modules
    // with this name, so we need to do full scope resolution.
    if (it->second.second) {
        auto searchScope = &scope;
        do {
            auto scopeIt = definitionMap.find({lookupName, searchScope});
            if (scopeIt != definitionMap.end()) {
                it = scopeIt;
                break;
            }

            searchScope = searchScope->asSymbol().getParentScope();
        } while (searchScope && searchScope != root.get());
    }

    auto& defList = it->second.first;
    if (resolvedConfig)
        return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, defList).first;

    // If there is a global priority list try to use that.
    for (auto lib : defaultLiblist) {
        for (auto def : defList) {
            if (def->getSourceLibrary() == lib)
                return def;
        }
    }

    // Otherwise return the first definition in the list -- it's already
    // sorted in priority order.
    return defList.empty() ? DefinitionLookupResult{} : DefinitionLookupResult{defList.front()};
}